

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int transposepara(int f,int n)

{
  char cVar1;
  int iVar2;
  int iStack_18;
  char flg;
  int status;
  int i;
  int n_local;
  int f_local;
  
  iStack_18 = 0;
  if (n == 0) {
    n_local = 1;
  }
  else {
    status = n;
    i = f;
    undo_boundary_enable(8,0);
    gotobop(8,1);
    curwp->w_markp = curwp->w_dotp;
    curwp->w_marko = curwp->w_doto;
    gotoeop(8,1);
    cVar1 = curbp->b_flag;
    kdelete();
    n_local = killregion(8,1);
    if (n_local == 1) {
      iVar2 = do_gotoeop(8,status,&stack0xffffffffffffffe8);
      if (iVar2 == 0) {
        ewprintf("Cannot transpose paragraph, end of buffer reached.");
        gotobop(8,iStack_18);
        yank(8,1);
        curbp->b_flag = cVar1;
        n_local = 0;
      }
      else {
        yank(8,1);
        undo_boundary_enable(8,1);
        n_local = 1;
      }
    }
  }
  return n_local;
}

Assistant:

int
transposepara(int f, int n)
{
	int	i = 0, status;
	char	flg;

	if (n == 0)
		return (TRUE);

	undo_boundary_enable(FFRAND, 0);

	/* find a paragraph, set mark, then goto the end */
	gotobop(FFRAND, 1);
	curwp->w_markp = curwp->w_dotp;
	curwp->w_marko = curwp->w_doto;
	(void)gotoeop(FFRAND, 1);

	/* take a note of buffer flags - we may need them */
	flg = curbp->b_flag;	

	/* clean out kill buffer then kill region */
	kdelete();
	if ((status = killregion(FFRAND, 1)) != TRUE)
		return (status);

	/* 
	 * Now step through n paragraphs. If we reach the end of buffer,
	 * stop and paste the killed region back, then display a message.
	 */
	if (do_gotoeop(FFRAND, n, &i) == FALSE) {
		ewprintf("Cannot transpose paragraph, end of buffer reached.");
		(void)gotobop(FFRAND, i);
		(void)yank(FFRAND, 1);
		curbp->b_flag = flg;	
		return (FALSE);
	}
	(void)yank(FFRAND, 1);

	undo_boundary_enable(FFRAND, 1);

	return (TRUE);
}